

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O3

uint32 Unicode::fromString(char *ch,usize len)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  if (len == 0) {
    return 0;
  }
  bVar1 = *ch;
  uVar3 = (uint)bVar1;
  if (-1 < (char)bVar1) {
    return uVar3;
  }
  uVar4 = (uint)bVar1;
  uVar6 = 2;
  if (((uVar4 & 0xffffffe0) != 0xc0) && (uVar6 = 3, (uVar4 & 0xfffffff0) != 0xe0)) {
    uVar6 = (ulong)((uVar4 & 0xfffffff8) == 0xf0) << 2;
  }
  if (len < uVar6) {
    return 0;
  }
  iVar2 = 0;
  iVar5 = (int)uVar6;
  if (iVar5 != 2) {
    if (iVar5 != 3) {
      if (iVar5 != 4) goto LAB_001073e7;
      iVar2 = uVar4 << 6;
      uVar3 = (uint)(byte)ch[1];
      ch = ch + 1;
    }
    iVar2 = (iVar2 + uVar3) * 0x40;
    uVar3 = (uint)(byte)ch[1];
    ch = ch + 1;
  }
  iVar2 = (iVar2 + uVar3) * 0x40;
  uVar3 = (uint)(byte)ch[1];
LAB_001073e7:
  return (uVar3 + iVar2) - fromString::utf8Offsets[uVar6];
}

Assistant:

static uint32 fromString(const char* ch, usize len)
  {
    if(len == 0)
      return 0;
    if((*(const uchar*)ch & 0x80) == 0) // ch < 0x80
      return *(const uchar*)ch;
    usize reqLen = length(*ch);
    if(len < reqLen)
      return 0;
    static const uint32 utf8Offsets[] = {0UL, 0UL, 0x00003080UL, 0x000E2080UL, 0x03C82080UL};
    uint32 result = 0;
    switch(reqLen)
    {
      case 4: result = (uint32)*(const uchar*)ch++ << 6;
      case 3: result += (uint32)*(const uchar*)ch++; result <<= 6;
      case 2: result += (uint32)*(const uchar*)ch++; result <<= 6;
      default: result += *(const uchar*)ch;
    }
    result -= utf8Offsets[reqLen];
    return result;
  }